

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O0

void iutest::TestEnv::set_test_filter(char *str)

{
  Variable *pVVar1;
  char *local_18;
  char *str_local;
  
  local_18 = str;
  if (str == (char *)0x0) {
    local_18 = "*";
  }
  pVVar1 = get_vars();
  std::__cxx11::string::operator=((string *)&pVVar1->m_test_filter,local_18);
  TestFlag::SetFlag(4,-1);
  return;
}

Assistant:

static void set_test_filter(const char* str)
    {
        get_vars().m_test_filter = str == NULL ? "*" : str;
        TestFlag::SetFlag(TestFlag::FILTERING_TESTS);
    }